

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImGuiWindowSettings * __thiscall
ImChunkStream<ImGuiWindowSettings>::next_chunk
          (ImChunkStream<ImGuiWindowSettings> *this,ImGuiWindowSettings *p)

{
  int iVar1;
  ImGuiWindowSettings *pIVar2;
  ImGuiWindowSettings *pIVar3;
  char *pcVar4;
  
  pcVar4 = (this->Buf).Data;
  if ((pcVar4 == (char *)0x0 || (ImGuiWindowSettings *)(pcVar4 + 4) <= p) &&
     (pIVar3 = (ImGuiWindowSettings *)(pcVar4 + (this->Buf).Size), p < pIVar3)) {
    iVar1._0_1_ = p[-1].Collapsed;
    iVar1._1_1_ = p[-1].WantApply;
    iVar1._2_2_ = *(undefined2 *)&p[-1].field_0xe;
    pIVar2 = (ImGuiWindowSettings *)((long)&p->ID + (long)iVar1);
    if (pIVar2 == (ImGuiWindowSettings *)&pIVar3->Pos) {
      pIVar2 = (ImGuiWindowSettings *)0x0;
    }
    else if (pIVar3 <= pIVar2) {
      pcVar4 = "p < end()";
      goto LAB_00167c89;
    }
    return pIVar2;
  }
  pcVar4 = "p >= begin() && p < end()";
LAB_00167c89:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_internal.h"
                ,0x25f,
                "T *ImChunkStream<ImGuiWindowSettings>::next_chunk(T *) [T = ImGuiWindowSettings]");
}

Assistant:

T*      next_chunk(T* p)            { size_t HDR_SZ = 4; IM_ASSERT(p >= begin() && p < end()); p = (T*)(void*)((char*)(void*)p + chunk_size(p)); if (p == (T*)(void*)((char*)end() + HDR_SZ)) return (T*)0; IM_ASSERT(p < end()); return p; }